

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

void __thiscall
CMU462::Vertex::getNeighborhood
          (Vertex *this,
          map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
          *seen,int depth)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  pointer pHVar4;
  HalfedgeIter *pHVar5;
  VertexIter *pVVar6;
  pointer pVVar7;
  double *pdVar8;
  pointer ppVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>,_bool>
  pVar10;
  _List_iterator<CMU462::Vertex> local_98;
  VertexIter u_1;
  _Rb_tree_iterator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_> local_80;
  _Self local_78;
  _Self local_70;
  Vector3D local_68;
  double local_50;
  _Self local_48;
  _Self local_40;
  iterator d;
  VertexIter u;
  double dist;
  HalfedgeIter h;
  int depth_local;
  map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
  *seen_local;
  Vertex *this_local;
  
  if (-1 < depth) {
    dist = (double)(this->_halfedge)._M_node;
    h._M_node._4_4_ = depth;
    u._M_node = (_List_node_base *)std::numeric_limits<double>::infinity();
    do {
      pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)&dist);
      pHVar5 = Halfedge::twin(pHVar4);
      pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar5);
      pVVar6 = Halfedge::vertex(pHVar4);
      d._M_node = (_Base_ptr)pVVar6->_M_node;
      pVVar7 = std::_List_iterator<CMU462::Vertex>::operator->((_List_iterator<CMU462::Vertex> *)&d)
      ;
      pHVar5 = halfedge(pVVar7);
      local_40._M_node =
           (_Base_ptr)
           std::
           map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
           ::find(seen,pHVar5);
      local_48._M_node =
           (_Base_ptr)
           std::
           map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
           ::end(seen);
      bVar2 = std::operator!=(&local_40,&local_48);
      if (bVar2) {
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>
                 ::operator->(&local_40);
        dVar1 = ppVar9->second;
        pVVar7 = std::_List_iterator<CMU462::Vertex>::operator->
                           ((_List_iterator<CMU462::Vertex> *)&d);
        Vector3D::operator-(&local_68,&pVVar7->position,&this->position);
        local_50 = Vector3D::norm(&local_68);
        local_50 = dVar1 + local_50;
        pdVar8 = std::min<double>(&local_50,(double *)&u);
        u._M_node = (_List_node_base *)*pdVar8;
      }
      pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)&dist);
      pHVar5 = Halfedge::twin(pHVar4);
      pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar5);
      pHVar5 = Halfedge::next(pHVar4);
      dist = (double)pHVar5->_M_node;
      bVar2 = std::operator!=((_Self *)&dist,&this->_halfedge);
    } while (bVar2);
    local_70._M_node =
         (_Base_ptr)
         std::
         map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
         ::find(seen,(key_type *)&dist);
    local_78._M_node =
         (_Base_ptr)
         std::
         map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
         ::end(seen);
    bVar3 = std::operator==(&local_70,&local_78);
    bVar2 = true;
    if (!bVar3) {
      local_80._M_node =
           (_Base_ptr)
           std::
           map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
           ::find(seen,(key_type *)&dist);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>::
               operator->(&local_80);
      bVar2 = (double)u._M_node < ppVar9->second;
    }
    if (bVar2) {
      pVar10 = std::
               map<std::_List_iterator<CMU462::Halfedge>,double,std::less<std::_List_iterator<CMU462::Halfedge>>,std::allocator<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>>
               ::emplace<std::_List_iterator<CMU462::Halfedge>&,double&>
                         ((map<std::_List_iterator<CMU462::Halfedge>,double,std::less<std::_List_iterator<CMU462::Halfedge>>,std::allocator<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>>
                           *)seen,(_List_iterator<CMU462::Halfedge> *)&dist,(double *)&u);
      u_1._M_node = (_List_node_base *)pVar10.first._M_node;
    }
    dist = (double)(this->_halfedge)._M_node;
    do {
      pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)&dist);
      pHVar5 = Halfedge::twin(pHVar4);
      pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar5);
      pVVar6 = Halfedge::vertex(pHVar4);
      local_98._M_node = pVVar6->_M_node;
      pVVar7 = std::_List_iterator<CMU462::Vertex>::operator->(&local_98);
      getNeighborhood(pVVar7,seen,h._M_node._4_4_ + -1);
      pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)&dist);
      pHVar5 = Halfedge::twin(pHVar4);
      pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar5);
      pHVar5 = Halfedge::next(pHVar4);
      dist = (double)pHVar5->_M_node;
      bVar2 = std::operator!=((_Self *)&dist,&this->_halfedge);
    } while (bVar2);
  }
  return;
}

Assistant:

void Vertex::getNeighborhood(map<HalfedgeIter, double>& seen, int depth) {
    if (depth < 0) return;

    HalfedgeIter h = _halfedge;
    double dist = INF_D;
    do {
      VertexIter u = h->twin()->vertex();
      auto d = seen.find(u->halfedge());
      if (d != seen.end()) {
        dist = std::min(d->second + (u->position - position).norm(), dist);
      }
      h = h->twin()->next();
    } while (h != _halfedge);

    if (seen.find(h) == seen.end() || seen.find(h)->second > dist) {
      seen.emplace(h, dist);
    }

    h = _halfedge;
    do {
      VertexIter u = h->twin()->vertex();
      u->getNeighborhood(seen, depth-1);
      h = h->twin()->next();
    } while (h != _halfedge);
  }